

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O0

int tunpack(lua_State *L)

{
  int iVar1;
  bool bVar2;
  long local_38;
  lua_Integer e;
  lua_Integer i;
  lua_Unsigned n;
  lua_State *L_local;
  
  e = luaL_optinteger(L,2,1);
  iVar1 = lua_type(L,3);
  if (iVar1 < 1) {
    local_38 = luaL_len(L,1);
  }
  else {
    local_38 = luaL_checkinteger(L,3);
  }
  if (local_38 < e) {
    L_local._4_4_ = 0;
  }
  else {
    i = local_38 - e;
    bVar2 = true;
    if ((ulong)i < 0x7fffffff) {
      i = i + 1;
      iVar1 = lua_checkstack(L,(int)i);
      bVar2 = iVar1 == 0;
    }
    if (bVar2) {
      L_local._4_4_ = luaL_error(L,"too many results to unpack");
    }
    else {
      for (; e < local_38; e = e + 1) {
        lua_geti(L,1,e);
      }
      lua_geti(L,1,local_38);
      L_local._4_4_ = (int)i;
    }
  }
  return L_local._4_4_;
}

Assistant:

static int tunpack (lua_State *L) {
  lua_Unsigned n;
  lua_Integer i = luaL_optinteger(L, 2, 1);
  lua_Integer e = luaL_opt(L, luaL_checkinteger, 3, luaL_len(L, 1));
  if (i > e) return 0;  /* empty range */
  n = l_castS2U(e) - l_castS2U(i);  /* number of elements minus 1 */
  if (l_unlikely(n >= (unsigned int)INT_MAX  ||
                 !lua_checkstack(L, (int)(++n))))
    return luaL_error(L, "too many results to unpack");
  for (; i < e; i++) {  /* push arg[i..e - 1] (to avoid overflows) */
    lua_geti(L, 1, i);
  }
  lua_geti(L, 1, e);  /* push last element */
  return (int)n;
}